

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O2

void __thiscall BiquadFilter::SetupLowpass(BiquadFilter *this,float cutoff,float samplerate,float Q)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = (cutoff * 6.2831855) / samplerate;
  fVar4 = sinf(fVar3);
  fVar4 = fVar4 / (Q + Q);
  fVar5 = cosf(fVar3);
  this->b0 = (1.0 - fVar5) * 0.5;
  fVar5 = cosf(fVar3);
  this->b1 = 1.0 - fVar5;
  fVar5 = cosf(fVar3);
  this->b2 = (1.0 - fVar5) * 0.5;
  fVar3 = cosf(fVar3);
  fVar5 = 1.0 / (fVar4 + 1.0);
  uVar1 = this->b0;
  uVar2 = this->b1;
  this->a1 = fVar3 * -2.0 * fVar5;
  this->a2 = (1.0 - fVar4) * fVar5;
  this->b0 = (float)uVar1 * fVar5;
  this->b1 = (float)uVar2 * fVar5;
  this->b2 = fVar5 * this->b2;
  return;
}

Assistant:

void BiquadFilter::SetupLowpass(float cutoff, float samplerate, float Q)
{
    float w0 = 2.0f * kPI * cutoff / samplerate, alpha = sinf(w0) / (2.0f * Q), a0;
    b0 =  (1.0f - cosf(w0)) * 0.5f;
    b1 =   1.0f - cosf(w0);
    b2 =  (1.0f - cosf(w0)) * 0.5f;
    a0 =   1.0f + alpha;
    a1 =  -2.0f * cosf(w0);
    a2 =   1.0f - alpha;
    float inv_a0 = 1.0f / a0; a1 *= inv_a0; a2 *= inv_a0; b0 *= inv_a0; b1 *= inv_a0; b2 *= inv_a0;
}